

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Client::read_response_line(Client *this,Stream *strm,Response *res)

{
  array<char,_2048UL> *this_00;
  bool bVar1;
  int iVar2;
  pointer fixed_buffer;
  FILE *__stream;
  ulong uVar3;
  char *__s;
  const_reference pvVar4;
  size_t *__n;
  string_type local_8d8;
  string_type local_8b8;
  undefined1 local_898 [8];
  cmatch m;
  undefined1 local_868 [8];
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  Response *res_local;
  Stream *strm_local;
  Client *this_local;
  
  this_00 = (array<char,_2048UL> *)((long)&line_reader.glowable_buffer_.field_2 + 8);
  fixed_buffer = std::array<char,_2048UL>::data(this_00);
  __stream = (FILE *)std::array<char,_2048UL>::size(this_00);
  detail::stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_868,strm,fixed_buffer,(size_t)__stream);
  uVar3 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_868,(char **)strm,__n,__stream);
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = false;
    m._M_begin._0_4_ = 1;
  }
  else {
    if ((read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Response&)::
                                     re_abi_cxx11_), iVar2 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,
                 "(HTTP/1\\.[01]) (\\d+?) .*\r\n",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_);
    }
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_898);
    __s = detail::stream_line_reader::ptr((stream_line_reader *)local_868);
    bVar1 = std::
            regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                      (__s,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            *)local_898,
                       &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,0);
    if (bVar1) {
      pvVar4 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_898,1);
      std::__cxx11::sub_match::operator_cast_to_string(&local_8b8,(sub_match *)pvVar4);
      std::__cxx11::string::operator=((string *)res,(string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_8b8);
      pvVar4 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_898,2);
      std::__cxx11::sub_match::operator_cast_to_string(&local_8d8,(sub_match *)pvVar4);
      iVar2 = std::__cxx11::stoi(&local_8d8,(size_t *)0x0,10);
      res->status = iVar2;
      std::__cxx11::string::~string((string *)&local_8d8);
    }
    this_local._7_1_ = true;
    m._M_begin._0_4_ = 1;
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_898);
  }
  detail::stream_line_reader::~stream_line_reader((stream_line_reader *)local_868);
  return this_local._7_1_;
}

Assistant:

inline bool Client::read_response_line(Stream &strm, Response &res) {
  std::array<char, 2048> buf;

  detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

  if (!line_reader.getline()) { return false; }

  const static std::regex re("(HTTP/1\\.[01]) (\\d+?) .*\r\n");

  std::cmatch m;
  if (std::regex_match(line_reader.ptr(), m, re)) {
    res.version = std::string(m[1]);
    res.status = std::stoi(std::string(m[2]));
  }

  return true;
}